

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_global_variables(Impl *this)

{
  undefined8 uVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  LinkageTypes LVar6;
  Id IVar7;
  int iVar8;
  Id IVar9;
  StorageClass SVar10;
  GlobalVariable *this_00;
  Type *pTVar11;
  ArrayType *pAVar12;
  uint64_t uVar13;
  Builder *pBVar14;
  Builder *pBVar15;
  void *pvVar16;
  Id var_id;
  StorageClass storage_class;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Constant *initializer;
  Id initializer_id;
  uint32_t alignment;
  uint32_t elem_count;
  ArrayType *array_type_1;
  ArrayType *array_type;
  Id IStack_40;
  bool padded_composite;
  Id scalar_type_id;
  Id pointee_type_id;
  AddressSpace address_space;
  GlobalVariable *global;
  __normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
  local_28;
  IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
  itr;
  Module *module;
  Impl *this_local;
  
  itr.iter._M_current =
       (__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>
        )LLVMBCParser::get_module(this->bitcode_parser);
  bVar2 = execution_model_has_incoming_payload(this->execution_model);
  if ((!bVar2) || (bVar2 = emit_incoming_payload(this), bVar2)) {
    bVar2 = execution_model_has_hit_attribute(this->execution_model);
    if ((!bVar2) || (bVar2 = emit_hit_attribute(this), bVar2)) {
      local_28._M_current = (GlobalVariable **)LLVMBC::Module::global_begin(itr.iter._M_current);
      while( true ) {
        global = (GlobalVariable *)LLVMBC::Module::global_end((Module *)itr.iter._M_current);
        bVar2 = LLVMBC::
                IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
                ::operator!=((IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
                              *)&local_28,
                             (IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
                              *)&global);
        if (!bVar2) break;
        this_00 = LLVMBC::
                  IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
                  ::operator*((IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
                               *)&local_28);
        pTVar11 = LLVMBC::Value::getType((Value *)this_00);
        uVar5 = LLVMBC::Type::getAddressSpace(pTVar11);
        cVar3 = (char)uVar5;
        LVar6 = LLVMBC::GlobalVariable::getLinkage(this_00);
        if (((LVar6 != ExternalLinkage) || (cVar3 == '\x03')) &&
           (LVar6 = LLVMBC::GlobalVariable::getLinkage(this_00), LVar6 != AppendingLinkage)) {
          IStack_40 = 0;
          bVar2 = false;
          if (((cVar3 == '\0') && (((this->options).extended_robustness.constant_lut & 1U) != 0)) &&
             ((bVar4 = LLVMBC::GlobalVariable::hasInitializer(this_00), bVar4 &&
              (bVar4 = LLVMBC::GlobalVariable::isConstant(this_00), bVar4)))) {
            pTVar11 = LLVMBC::Value::getType((Value *)this_00);
            pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
            pAVar12 = LLVMBC::dyn_cast<LLVMBC::ArrayType>(pTVar11);
            bVar2 = pAVar12 != (ArrayType *)0x0;
            if (bVar2) {
              pTVar11 = LLVMBC::Type::getArrayElementType(&pAVar12->super_Type);
              IVar7 = get_type_id(this,pTVar11,0);
              pBVar14 = builder(this);
              pBVar15 = builder(this);
              uVar13 = LLVMBC::Type::getArrayNumElements(&pAVar12->super_Type);
              IVar9 = spv::Builder::makeUintConstant(pBVar15,(int)uVar13 + 1,false);
              IStack_40 = spv::Builder::makeArrayType(pBVar14,IVar7,IVar9,0);
            }
          }
          else if ((cVar3 == '\x03') && (((this->shader_analysis).require_wmma & 1U) != 0)) {
            pTVar11 = LLVMBC::Value::getType((Value *)this_00);
            pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
            pAVar12 = LLVMBC::dyn_cast<LLVMBC::ArrayType>(pTVar11);
            if (pAVar12 != (ArrayType *)0x0) {
              pTVar11 = LLVMBC::Type::getArrayElementType(&pAVar12->super_Type);
              IVar7 = get_type_id(this,pTVar11,0);
              uVar13 = LLVMBC::Type::getArrayNumElements(&pAVar12->super_Type);
              pTVar11 = LLVMBC::Type::getArrayElementType(&pAVar12->super_Type);
              uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar11);
              iVar8 = (int)(0x1000 / (ulong)uVar5);
              pBVar14 = builder(this);
              pBVar15 = builder(this);
              IVar9 = spv::Builder::makeUintConstant
                                (pBVar15,((int)uVar13 + iVar8) - 1U & (iVar8 - 1U ^ 0xffffffff),
                                 false);
              IStack_40 = spv::Builder::makeArrayType(pBVar14,IVar7,IVar9,0);
            }
          }
          if (IStack_40 == 0) {
            pTVar11 = LLVMBC::Value::getType((Value *)this_00);
            pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
            IStack_40 = get_type_id(this,pTVar11,0);
          }
          if (IStack_40 != 0) {
            initializer._4_4_ = 0;
            cb = (_func_void_void_ptr_LogLevel_char_ptr *)0x0;
            bVar4 = LLVMBC::GlobalVariable::hasInitializer(this_00);
            if (bVar4) {
              cb = (_func_void_void_ptr_LogLevel_char_ptr *)
                   LLVMBC::GlobalVariable::getInitializer(this_00);
            }
            if ((cb != (_func_void_void_ptr_LogLevel_char_ptr *)0x0) &&
               (bVar4 = LLVMBC::isa<LLVMBC::UndefValue>((Value *)cb), bVar4)) {
              cb = (_func_void_void_ptr_LogLevel_char_ptr *)0x0;
            }
            if ((cVar3 == '\x03') && (cb != (_func_void_void_ptr_LogLevel_char_ptr *)0x0)) {
              buffer._4088_8_ = get_thread_log_callback();
              if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
                fprintf(_stderr,
                        "[WARN]: Global variable address space cannot have initializer! Ignoring ...\n"
                       );
                fflush(_stderr);
              }
              else {
                snprintf((char *)&var_id,0x1000,
                         "Global variable address space cannot have initializer! Ignoring ...\n");
                uVar1 = buffer._4088_8_;
                pvVar16 = get_thread_log_callback_userdata();
                (*(code *)uVar1)(pvVar16,1,&var_id);
              }
              cb = (_func_void_void_ptr_LogLevel_char_ptr *)0x0;
            }
            if (cb != (_func_void_void_ptr_LogLevel_char_ptr *)0x0) {
              if (bVar2) {
                initializer._4_4_ = get_padded_constant_array(this,IStack_40,(Constant *)cb);
              }
              else {
                initializer._4_4_ = get_id_for_constant(this,(Constant *)cb,0);
              }
            }
            SVar10 = StorageClassPrivate;
            if (cVar3 == '\x03') {
              SVar10 = StorageClassWorkgroup;
            }
            SVar10 = get_effective_storage_class(this,(Value *)this_00,SVar10);
            IVar7 = create_variable_with_initializer
                              (this,SVar10,IStack_40,initializer._4_4_,(char *)0x0);
            pTVar11 = LLVMBC::Value::getType((Value *)this_00);
            pTVar11 = LLVMBC::Type::getPointerElementType(pTVar11);
            decorate_relaxed_precision(this,pTVar11,IVar7,false);
            rewrite_value(this,(Value *)this_00,IVar7);
          }
        }
        LLVMBC::
        IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
        ::operator++((IteratorAdaptor<LLVMBC::GlobalVariable,___gnu_cxx::__normal_iterator<LLVMBC::GlobalVariable_*const_*,_std::vector<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>_>_>
                      *)&local_28);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Converter::Impl::emit_global_variables()
{
	auto &module = bitcode_parser.get_module();

	if (execution_model_has_incoming_payload(execution_model))
		if (!emit_incoming_payload())
			return false;

	if (execution_model_has_hit_attribute(execution_model))
		if (!emit_hit_attribute())
			return false;

	for (auto itr = module.global_begin(); itr != module.global_end(); ++itr)
	{
		llvm::GlobalVariable &global = *itr;

		auto address_space = static_cast<DXIL::AddressSpace>(global.getType()->getAddressSpace());

		// Workarounds for DXR. RT resources tend to be declared with external linkage + structs.
		// Groupshared is also declared with external linkage, even if that is bogus.
		// Make sure we declare global internal struct LUTs at the very least ...
		if (global.getLinkage() == llvm::GlobalVariable::ExternalLinkage &&
		    address_space != DXIL::AddressSpace::GroupShared)
		{
			continue;
		}

		// Ignore @llvm.global_ctors(). Only observed once with dummy ctor.
		// It probably is not intended to work.
		if (global.getLinkage() == llvm::GlobalVariable::AppendingLinkage)
			continue;

		spv::Id pointee_type_id = 0;
		spv::Id scalar_type_id = 0;
		bool padded_composite = false;

		if (address_space == DXIL::AddressSpace::Thread &&
		    options.extended_robustness.constant_lut &&
		    global.hasInitializer() &&
		    global.isConstant())
		{
			if (auto *array_type = llvm::dyn_cast<llvm::ArrayType>(global.getType()->getPointerElementType()))
			{
				scalar_type_id = get_type_id(array_type->getArrayElementType());
				pointee_type_id = builder().makeArrayType(
					scalar_type_id, builder().makeUintConstant(array_type->getArrayNumElements() + 1), false);
				padded_composite = true;
			}
		}
		else if (address_space == DXIL::AddressSpace::GroupShared &&
		         shader_analysis.require_wmma)
		{
			// Workaround for bugged WMMA shaders.
			// The shaders rely on AMD aligning LDS size to 512 bytes.
			// This avoids overflow spilling into LDSTranspose area by mistake, which breaks some shaders.
			if (auto *array_type = llvm::dyn_cast<llvm::ArrayType>(global.getType()->getPointerElementType()))
			{
				scalar_type_id = get_type_id(array_type->getArrayElementType());
				uint32_t elem_count = array_type->getArrayNumElements();
				uint32_t alignment = (512 * 8) / array_type->getArrayElementType()->getIntegerBitWidth();
				elem_count = (elem_count + alignment - 1) & ~(alignment - 1);
				pointee_type_id = builder().makeArrayType(
					scalar_type_id, builder().makeUintConstant(elem_count), false);
			}
		}

		if (!pointee_type_id)
			pointee_type_id = get_type_id(global.getType()->getPointerElementType());

		// Happens for some global variables in DXR for some reason, benign.
		if (pointee_type_id == 0)
			continue;

		spv::Id initializer_id = 0;

		llvm::Constant *initializer = nullptr;
		if (global.hasInitializer())
			initializer = global.getInitializer();
		if (initializer && llvm::isa<llvm::UndefValue>(initializer))
			initializer = nullptr;

		if (address_space == DXIL::AddressSpace::GroupShared)
		{
			if (initializer)
			{
				// FIXME: Is this even legal DXIL?
				LOGW("Global variable address space cannot have initializer! Ignoring ...\n");
				initializer = nullptr;
			}
		}

		if (initializer)
		{
			if (padded_composite)
				initializer_id = get_padded_constant_array(pointee_type_id, initializer);
			else
				initializer_id = get_id_for_constant(initializer, 0);
		}

		spv::StorageClass storage_class = address_space == DXIL::AddressSpace::GroupShared
		                                  ? spv::StorageClassWorkgroup : spv::StorageClassPrivate;
		spv::Id var_id = create_variable_with_initializer(
			get_effective_storage_class(&global, storage_class),
			pointee_type_id, initializer_id);

		decorate_relaxed_precision(global.getType()->getPointerElementType(), var_id, false);
		rewrite_value(&global, var_id);
	}

	return true;
}